

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_uint64 ma_dr_wav__read_list_label_or_note_to_metadata_obj
                    (ma_dr_wav__metadata_parser *pParser,ma_dr_wav_metadata *pMetadata,
                    ma_uint64 chunkSize,ma_dr_wav_metadata_type type)

{
  ma_uint8 *pmVar1;
  uint uVar2;
  size_t sVar3;
  ma_uint8 cueIDBuffer [4];
  ma_uint32 local_2c;
  
  sVar3 = (*pParser->onRead)(pParser->pReadSeekUserData,&local_2c,4);
  if (sVar3 == 4) {
    pMetadata->type = type;
    (pMetadata->data).cue.cuePointCount = local_2c;
    uVar2 = (int)chunkSize - 4;
    if (uVar2 == 0) {
      (pMetadata->data).smpl.productId = 0;
      (pMetadata->data).cue.pCuePoints = (ma_dr_wav_cue_point *)0x0;
    }
    else {
      (pMetadata->data).smpl.productId = (int)chunkSize - 5;
      pmVar1 = pParser->pDataCursor;
      pParser->pDataCursor = pmVar1 + uVar2;
      (pMetadata->data).bext.pOriginatorName = (char *)pmVar1;
      sVar3 = (*pParser->onRead)(pParser->pReadSeekUserData,pmVar1,(ulong)uVar2);
      sVar3 = sVar3 + 4;
    }
  }
  return sVar3;
}

Assistant:

MA_PRIVATE ma_uint64 ma_dr_wav__read_list_label_or_note_to_metadata_obj(ma_dr_wav__metadata_parser* pParser, ma_dr_wav_metadata* pMetadata, ma_uint64 chunkSize, ma_dr_wav_metadata_type type)
{
    ma_uint8 cueIDBuffer[MA_DR_WAV_LIST_LABEL_OR_NOTE_BYTES];
    ma_uint64 totalBytesRead = 0;
    size_t bytesJustRead = ma_dr_wav__metadata_parser_read(pParser, cueIDBuffer, sizeof(cueIDBuffer), &totalBytesRead);
    MA_DR_WAV_ASSERT(pParser->stage == ma_dr_wav__metadata_parser_stage_read);
    if (bytesJustRead == sizeof(cueIDBuffer)) {
        ma_uint32 sizeIncludingNullTerminator;
        pMetadata->type = type;
        pMetadata->data.labelOrNote.cuePointId = ma_dr_wav_bytes_to_u32(cueIDBuffer);
        sizeIncludingNullTerminator = (ma_uint32)chunkSize - MA_DR_WAV_LIST_LABEL_OR_NOTE_BYTES;
        if (sizeIncludingNullTerminator > 0) {
            pMetadata->data.labelOrNote.stringLength = sizeIncludingNullTerminator - 1;
            pMetadata->data.labelOrNote.pString      = (char*)ma_dr_wav__metadata_get_memory(pParser, sizeIncludingNullTerminator, 1);
            MA_DR_WAV_ASSERT(pMetadata->data.labelOrNote.pString != NULL);
            ma_dr_wav__metadata_parser_read(pParser, pMetadata->data.labelOrNote.pString, sizeIncludingNullTerminator, &totalBytesRead);
        } else {
            pMetadata->data.labelOrNote.stringLength = 0;
            pMetadata->data.labelOrNote.pString      = NULL;
        }
    }
    return totalBytesRead;
}